

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cc
# Opt level: O2

void gimage::getPrefixAlternatives
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *list,string *depthname,char *spath)

{
  pointer pbVar1;
  pointer pbVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  char cVar6;
  ulong uVar7;
  ulong uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  ulong local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar4 = std::__cxx11::string::find_last_of((char *)depthname,0x14e4f7);
  cVar6 = (char)depthname;
  uVar5 = std::__cxx11::string::rfind(cVar6,0x3a);
  if (uVar5 != 0xffffffffffffffff) {
    iVar3 = std::__cxx11::string::compare((ulong)depthname,uVar5,(char *)0x2);
    if (iVar3 != 0) {
      std::__cxx11::string::substr((ulong)&local_a0,(ulong)depthname);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)list,&local_a0
                );
      std::__cxx11::string::~string((string *)&local_a0);
    }
  }
  uVar8 = lVar4 + 1;
  uVar5 = std::__cxx11::string::rfind(cVar6,0x2e);
  local_80 = uVar8;
  if (uVar5 == 0xffffffffffffffff || uVar5 <= uVar8) goto LAB_00137c84;
  std::__cxx11::string::substr((ulong)&local_a0,(ulong)depthname);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)list,&local_a0);
  while( true ) {
    std::__cxx11::string::~string((string *)&local_a0);
LAB_00137c84:
    uVar5 = std::__cxx11::string::rfind(cVar6,0x5f);
    if ((uVar5 == 0xffffffffffffffff) || (uVar5 <= local_80)) break;
    std::__cxx11::string::substr((ulong)&local_a0,(ulong)depthname);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)list,&local_a0);
  }
  if ((spath != (char *)0x0) && (*spath != '\0')) {
    pbVar1 = (list->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pbVar2 = (list->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    dir.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    dir.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    dir.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&local_a0,spath,(allocator *)&local_50);
    gutil::split(&dir,&local_a0,':',true);
    uVar8 = (ulong)((long)pbVar1 - (long)pbVar2) >> 5;
    std::__cxx11::string::~string((string *)&local_a0);
    uVar7 = 0;
    uVar5 = uVar8 & 0xffffffff;
    if ((int)uVar8 < 1) {
      uVar5 = uVar7;
    }
    for (; uVar7 < (ulong)((long)dir.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)dir.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5); uVar7 = uVar7 + 1)
    {
      if (dir.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_dataplus._M_p
          [dir.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_string_length - 1] != '/') {
        std::__cxx11::string::push_back
                  ((char)dir.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + (char)uVar7 * ' ');
      }
      for (lVar4 = 0;
          pbVar1 = dir.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start, uVar5 * 0x20 != lVar4;
          lVar4 = lVar4 + 0x20) {
        std::__cxx11::string::substr
                  ((ulong)&local_50,
                   (long)&(((list->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar4);
        std::operator+(&local_a0,pbVar1 + uVar7,&local_50);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)list,
                   &local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&dir);
  }
  return;
}

Assistant:

void getPrefixAlternatives(std::vector<std::string> &list, const std::string &depthname,
                           const char *spath)
{
  // determine possible prefixes

  size_t spos, pos;

  spos=depthname.find_last_of("/\\");

  if (spos == depthname.npos)
  {
    spos=0;
  }
  else
  {
    spos++;
  }

  pos=depthname.rfind(':');

  if (pos != depthname.npos && depthname.compare(pos, 2, ":\\") != 0)
  {
    list.push_back(depthname.substr(0, pos));
  }

  pos=depthname.rfind('.');

  if (pos != depthname.npos && pos > spos)
  {
    list.push_back(depthname.substr(0, pos));
  }

  pos=depthname.rfind('_', pos-1);

  while (pos != depthname.npos && pos > spos)
  {
    list.push_back(depthname.substr(0, pos));
    pos=depthname.rfind('_', pos-1);
  }

  int n=static_cast<int>(list.size());

  // combine possible prefixes with all directories of the optional search
  // path

  if (spath != 0 && spath[0] != '\0')
  {
    std::vector<std::string> dir;

#ifdef WIN32
    gutil::split(dir, spath, ';');
#else
    gutil::split(dir, spath, ':');
#endif

    for (size_t i=0; i<dir.size(); i++)
    {
#ifdef WIN32

      if (dir[i][dir[i].size()-1] != '\\')
      {
        dir[i].push_back('\\');
      }

#else

      if (dir[i][dir[i].size()-1] != '/')
      {
        dir[i].push_back('/');
      }

#endif

      for (int k=0; k<n; k++)
      {
        list.push_back(dir[i]+list[k].substr(spos));
      }
    }
  }
}